

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O1

void __thiscall kj::_::Once::runOnce(Once *this,Initializer *init)

{
  int iVar1;
  bool bVar2;
  UnwindDetector _kjUnwindDetector235;
  UnwindDetector local_3c;
  UnwindDetector *local_38;
  Once *local_30;
  undefined1 local_28;
  
  LOCK();
  iVar1 = *(int *)this;
  bVar2 = iVar1 == 0;
  if (bVar2) {
    *(undefined4 *)this = 1;
    iVar1 = 0;
  }
  UNLOCK();
  do {
    if (bVar2) {
      UnwindDetector::UnwindDetector(&local_3c);
      local_28 = 0;
      local_38 = &local_3c;
      local_30 = this;
      (*(code *)**(undefined8 **)init)(init);
      bVar2 = UnwindDetector::isUnwinding(&local_3c);
      if (bVar2) {
        LOCK();
        iVar1 = *(int *)this;
        *(undefined4 *)this = 0;
        UNLOCK();
        if (iVar1 == 2) {
          syscall(0xca,this,0x81,0x7fffffff,0,0,0);
        }
      }
      LOCK();
      iVar1 = *(int *)this;
      *(undefined4 *)this = 3;
      UNLOCK();
      if (iVar1 == 2) {
        syscall(0xca,this,0x81,0x7fffffff,0,0,0);
      }
      return;
    }
LAB_00202765:
    do {
      if (iVar1 == 1) {
        LOCK();
        iVar1 = *(int *)this;
        bVar2 = iVar1 == 1;
        if (bVar2) {
          *(undefined4 *)this = 2;
          iVar1 = 1;
        }
        UNLOCK();
        if (!bVar2) goto LAB_00202765;
      }
      else if (iVar1 == 3) {
        return;
      }
      syscall(0xca,this,0x80,2,0,0,0);
      iVar1 = *(int *)this;
    } while (iVar1 != 0);
    LOCK();
    iVar1 = *(int *)this;
    bVar2 = iVar1 == 0;
    if (bVar2) {
      *(undefined4 *)this = 1;
      iVar1 = 0;
    }
    UNLOCK();
  } while( true );
}

Assistant:

void Once::runOnce(Initializer& init) {
startOver:
  uint state = UNINITIALIZED;
  if (__atomic_compare_exchange_n(&futex, &state, INITIALIZING, false,
                                  __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
    // It's our job to initialize!
    {
      KJ_ON_SCOPE_FAILURE({
        // An exception was thrown by the initializer.  We have to revert.
        if (__atomic_exchange_n(&futex, UNINITIALIZED, __ATOMIC_RELEASE) ==
            INITIALIZING_WITH_WAITERS) {
          // Someone was waiting for us to finish.
          syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, NULL, NULL, 0);
        }
      });

      init.run();
    }
    if (__atomic_exchange_n(&futex, INITIALIZED, __ATOMIC_RELEASE) ==
        INITIALIZING_WITH_WAITERS) {
      // Someone was waiting for us to finish.
      syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, NULL, NULL, 0);
    }
  } else {
    for (;;) {
      if (state == INITIALIZED) {
        break;
      } else if (state == INITIALIZING) {
        // Initialization is taking place in another thread.  Indicate that we're waiting.
        if (!__atomic_compare_exchange_n(&futex, &state, INITIALIZING_WITH_WAITERS, true,
                                         __ATOMIC_ACQUIRE, __ATOMIC_ACQUIRE)) {
          // State changed, retry.
          continue;
        }
      } else {
        KJ_DASSERT(state == INITIALIZING_WITH_WAITERS);
      }

      // Wait for initialization.
      syscall(SYS_futex, &futex, FUTEX_WAIT_PRIVATE, INITIALIZING_WITH_WAITERS, NULL, NULL, 0);
      state = __atomic_load_n(&futex, __ATOMIC_ACQUIRE);

      if (state == UNINITIALIZED) {
        // Oh hey, apparently whoever was trying to initialize gave up.  Let's take it from the
        // top.
        goto startOver;
      }
    }
  }
}